

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O2

string * glu::sl::injectExtensionRequirements
                   (string *__return_storage_ptr__,string *baseCode,
                   vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
                   *extensions,ShaderType shaderType)

{
  pointer pRVar1;
  bool bVar2;
  ostream *poVar3;
  istream *piVar4;
  char *pcVar5;
  long lVar6;
  size_t ndx;
  ulong uVar7;
  string local_4e0 [8];
  long local_4d8;
  string line;
  ostringstream extStr;
  ostringstream resultBuf;
  istringstream baseCodeBuf;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&baseCodeBuf,(string *)baseCode,_S_in)
  ;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&resultBuf);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&extStr);
  lVar6 = 0;
  for (uVar7 = 0;
      pRVar1 = (extensions->
               super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar7 < (ulong)((long)(extensions->
                            super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1 >> 5);
      uVar7 = uVar7 + 1) {
    if ((*(uint *)((long)&pRVar1->effectiveStages + lVar6) & 1 << ((byte)shaderType & 0x1f)) != 0) {
      poVar3 = std::operator<<((ostream *)&extStr,"#extension ");
      poVar3 = std::operator<<(poVar3,*(string **)
                                       ((long)&(((extensions->
                                                 super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               alternatives).
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl + lVar6));
      std::operator<<(poVar3," : require\n");
    }
    lVar6 = lVar6 + 0x20;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string(local_4e0);
  if (local_4d8 == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)baseCode);
  }
  else {
    bVar2 = true;
    while (piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)&baseCodeBuf,(string *)&line),
          ((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) == 0) {
      lVar6 = std::__cxx11::string::find_first_not_of((char *)&line,0x88d2e4);
      if (lVar6 == -1) {
        if (bVar2) goto LAB_007609e7;
LAB_00760a07:
        bVar2 = false;
      }
      else {
        pcVar5 = (char *)std::__cxx11::string::at((ulong)&line);
        if ((bool)(*pcVar5 != '#' & bVar2)) {
LAB_007609e7:
          std::__cxx11::stringbuf::str();
          std::operator<<((ostream *)&resultBuf,local_4e0);
          std::__cxx11::string::~string(local_4e0);
          goto LAB_00760a07;
        }
      }
      poVar3 = std::operator<<((ostream *)&resultBuf,(string *)&line);
      std::operator<<(poVar3,"\n");
    }
    std::__cxx11::stringbuf::str();
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&extStr);
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&resultBuf);
  std::__cxx11::istringstream::~istringstream((istringstream *)&baseCodeBuf);
  return __return_storage_ptr__;
}

Assistant:

std::string injectExtensionRequirements (const std::string& baseCode, const std::vector<RequiredExtension>& extensions, glu::ShaderType shaderType)
{
	std::istringstream	baseCodeBuf					(baseCode);
	std::ostringstream	resultBuf;
	std::string			line;
	bool				firstNonPreprocessorLine	= true;
	std::ostringstream	extStr;

	generateExtensionStatements(extStr, extensions, shaderType);

	// skip if no requirements
	if (extStr.str().empty())
		return baseCode;

	while (std::getline(baseCodeBuf, line))
	{
		// begins with '#'?
		const std::string::size_type	firstNonWhitespace		= line.find_first_not_of("\t ");
		const bool						isPreprocessorDirective	= (firstNonWhitespace != std::string::npos && line.at(firstNonWhitespace) == '#');

		// Inject #extensions
		if (!isPreprocessorDirective && firstNonPreprocessorLine)
		{
			firstNonPreprocessorLine = false;
			resultBuf << extStr.str();
		}

		resultBuf << line << "\n";
	}

	return resultBuf.str();
}